

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

string * __thiscall
leveldb::Reverse_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,Slice *key)

{
  string *extraout_RAX;
  string *psVar1;
  string *extraout_RAX_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  undefined1 *puVar2;
  string str;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,this,this + (long)&key->data_)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  psVar1 = extraout_RAX;
  for (puVar2 = local_40 + local_38; puVar2 != local_40; puVar2 = puVar2 + -1) {
    psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (puVar2 != local_30) {
    operator_delete(local_40);
    psVar1 = extraout_RAX_00;
  }
  return psVar1;
}

Assistant:

static std::string Reverse(const Slice& key) {
  std::string str(key.ToString());
  std::string rev("");
  for (std::string::reverse_iterator rit = str.rbegin(); rit != str.rend();
       ++rit) {
    rev.push_back(*rit);
  }
  return rev;
}